

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool isItRandom<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  undefined1 auVar1 [16];
  undefined1 *puVar2;
  long lVar3;
  ostream *poVar4;
  uint k;
  value_type *__val;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  CyclicHash<unsigned_int,_unsigned_char> hf;
  CyclicHash<unsigned_int,_unsigned_char> base;
  CyclicHash<unsigned_int,_unsigned_char> local_860;
  CyclicHash<unsigned_int,_unsigned_char> local_448;
  long lVar10;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"checking that it is randomized ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  puVar2 = (undefined1 *)operator_new(5);
  *puVar2 = 0;
  *(undefined4 *)(puVar2 + 1) = 0;
  auVar1 = _DAT_0010b070;
  lVar3 = 0;
  auVar9 = _DAT_0010b060;
  do {
    if (SUB164(auVar9 ^ auVar1,4) == -0x80000000 && SUB164(auVar9 ^ auVar1,0) < -0x7ffffffb) {
      puVar2[lVar3] = (char)lVar3;
      puVar2[lVar3 + 1] = (char)lVar3 + '\x01';
    }
    lVar3 = lVar3 + 2;
    lVar10 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar10 + 2;
  } while (lVar3 != 6);
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&local_448,5,L);
  lVar3 = 0;
  uVar6 = 0;
  do {
    uVar6 = (uVar6 >> ((char)local_448.wordsize - 1U & 0x1f) | (uVar6 & local_448.mask1) * 2) ^
            local_448.hasher.hashvalues[(byte)puVar2[lVar3]];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  uVar7 = 0;
  bVar8 = true;
  while( true ) {
    CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&local_860,5,L);
    lVar3 = 0;
    uVar5 = 0;
    do {
      uVar5 = (uVar5 >> ((char)local_860.wordsize - 1U & 0x1f) | (uVar5 & local_860.mask1) * 2) ^
              local_860.hasher.hashvalues[(byte)puVar2[lVar3]];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    if (uVar5 != uVar6) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"collision ",10);
    poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar8 = uVar7 < 99;
    uVar7 = uVar7 + 1;
    if (uVar7 == 100) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Not randomized! ",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      bVar8 = false;
LAB_0010616f:
      operator_delete(puVar2);
      return bVar8;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"It is randomized! ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  goto LAB_0010616f;
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}